

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O0

double __thiscall soplex::SPxLPBase<double>::maxAbsNzo(SPxLPBase<double> *this,bool unscaled)

{
  int iVar1;
  int iVar2;
  byte in_SIL;
  SPxLPBase<double> *in_RDI;
  double extraout_XMM0_Qa;
  double dVar3;
  double m_1;
  int i_1;
  double m;
  int i;
  double maxi;
  int in_stack_ffffffffffffffbc;
  uint uVar4;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar5;
  uint local_1c;
  double local_18;
  
  local_18 = 0.0;
  if (((in_SIL & 1) == 0) || ((in_RDI->_isScaled & 1U) == 0)) {
    iVar1 = 0;
    while (iVar5 = iVar1, iVar2 = nCols((SPxLPBase<double> *)0x239fe1), iVar1 < iVar2) {
      colVector(in_RDI,in_stack_ffffffffffffffbc);
      dVar3 = SVectorBase<double>::maxAbs
                        ((SVectorBase<double> *)CONCAT44(iVar5,in_stack_ffffffffffffffd0));
      if (local_18 < dVar3) {
        local_18 = dVar3;
      }
      iVar1 = iVar5 + 1;
    }
  }
  else {
    local_1c = 0;
    while (uVar4 = local_1c, iVar1 = nCols((SPxLPBase<double> *)0x239f74), (int)uVar4 < iVar1) {
      (*in_RDI->lp_scaler->_vptr_SPxScaler[0x12])(in_RDI->lp_scaler,in_RDI,(ulong)local_1c);
      if (local_18 < extraout_XMM0_Qa) {
        local_18 = extraout_XMM0_Qa;
      }
      local_1c = local_1c + 1;
    }
  }
  return local_18;
}

Assistant:

inline
R SPxLPBase<R>::maxAbsNzo(bool unscaled) const
{
   R maxi = 0.0;

   if(unscaled && _isScaled)
   {
      assert(lp_scaler != nullptr);

      for(int i = 0; i < nCols(); ++i)
      {
         R m = lp_scaler->getColMaxAbsUnscaled(*this, i);

         if(m > maxi)
            maxi = m;
      }
   }
   else
   {
      for(int i = 0; i < nCols(); ++i)
      {
         R m = colVector(i).maxAbs();

         if(m > maxi)
            maxi = m;
      }
   }

   assert(maxi >= 0.0);

   return maxi;
}